

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qhash.h
# Opt level: O3

void __thiscall
QHashPrivate::Data<QHashPrivate::Node<ProKey,_ProFunctionDef>_>::rehash
          (Data<QHashPrivate::Node<ProKey,_ProFunctionDef>_> *this,size_t sizeHint)

{
  ProString *str;
  byte bVar1;
  ulong uVar2;
  Span *pSVar3;
  Entry *pEVar4;
  ulong uVar5;
  Node<ProKey,_ProFunctionDef> *this_00;
  ulong uVar6;
  size_t index;
  long lVar7;
  size_t sVar8;
  long lVar9;
  R RVar10;
  Bucket BVar11;
  Span *local_50;
  
  if (sizeHint == 0) {
    sizeHint = this->size;
  }
  sVar8 = 0x80;
  if ((0x40 < sizeHint) && (sVar8 = 0xffffffffffffffff, sizeHint >> 0x3e == 0)) {
    lVar7 = 0x3f;
    if (sizeHint != 0) {
      for (; sizeHint >> lVar7 == 0; lVar7 = lVar7 + -1) {
      }
    }
    sVar8 = 1L << (0x41 - ((byte)lVar7 ^ 0x3f) & 0x3f);
  }
  uVar2 = this->numBuckets;
  pSVar3 = this->spans;
  RVar10 = allocateSpans(sVar8);
  this->spans = (Span *)RVar10.spans;
  this->numBuckets = sVar8;
  if (uVar2 < 0x80) {
    if (pSVar3 == (Span *)0x0) {
      return;
    }
  }
  else {
    uVar6 = 0;
    local_50 = pSVar3;
    do {
      lVar7 = 0;
      do {
        bVar1 = local_50->offsets[lVar7];
        if (bVar1 != 0xff) {
          pEVar4 = pSVar3[uVar6].entries;
          str = (ProString *)(pEVar4 + bVar1);
          uVar5 = this->seed;
          sVar8 = qHash(str);
          BVar11 = findBucketWithHash<ProKey>(this,(ProKey *)str,uVar5 ^ sVar8);
          this_00 = Span<QHashPrivate::Node<ProKey,_ProFunctionDef>_>::insert
                              (BVar11.span,BVar11.index);
          ProString::ProString((ProString *)this_00,str);
          (this_00->value).m_pro = *(ProFile **)(pEVar4[bVar1].storage.data + 0x30);
          (this_00->value).m_offset = *(int *)(pEVar4[bVar1].storage.data + 0x38);
          pEVar4 = pEVar4 + bVar1;
          (pEVar4->storage).data[0x30] = '\0';
          (pEVar4->storage).data[0x31] = '\0';
          (pEVar4->storage).data[0x32] = '\0';
          (pEVar4->storage).data[0x33] = '\0';
          (pEVar4->storage).data[0x34] = '\0';
          (pEVar4->storage).data[0x35] = '\0';
          (pEVar4->storage).data[0x36] = '\0';
          (pEVar4->storage).data[0x37] = '\0';
        }
        lVar7 = lVar7 + 1;
      } while (lVar7 != 0x80);
      Span<QHashPrivate::Node<ProKey,_ProFunctionDef>_>::freeData(pSVar3 + uVar6);
      uVar6 = uVar6 + 1;
      local_50 = local_50 + 1;
    } while (uVar6 != uVar2 >> 7);
  }
  lVar7 = *(long *)&pSVar3[-1].allocated;
  if (lVar7 != 0) {
    lVar9 = lVar7 * 0x90;
    do {
      Span<QHashPrivate::Node<ProKey,_ProFunctionDef>_>::freeData
                ((Span<QHashPrivate::Node<ProKey,_ProFunctionDef>_> *)(pSVar3[-1].offsets + lVar9));
      lVar9 = lVar9 + -0x90;
    } while (lVar9 != 0);
  }
  operator_delete__(&pSVar3[-1].allocated,lVar7 * 0x90 + 8);
  return;
}

Assistant:

void rehash(size_t sizeHint = 0)
    {
        if (sizeHint == 0)
            sizeHint = size;
        size_t newBucketCount = GrowthPolicy::bucketsForCapacity(sizeHint);

        Span *oldSpans = spans;
        size_t oldBucketCount = numBuckets;
        spans = allocateSpans(newBucketCount).spans;
        numBuckets = newBucketCount;
        size_t oldNSpans = oldBucketCount >> SpanConstants::SpanShift;

        for (size_t s = 0; s < oldNSpans; ++s) {
            Span &span = oldSpans[s];
            for (size_t index = 0; index < SpanConstants::NEntries; ++index) {
                if (!span.hasNode(index))
                    continue;
                Node &n = span.at(index);
                auto it = findBucket(n.key);
                Q_ASSERT(it.isUnused());
                Node *newNode = it.insert();
                new (newNode) Node(std::move(n));
            }
            span.freeData();
        }
        delete[] oldSpans;
    }